

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_boundary_constraint
          (LatticeImpl *this,size_t pos,int boundary_constraint_type)

{
  int iVar1;
  undefined4 extraout_var;
  value_type_conflict5 local_19;
  
  if ((this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*(this->super_Lattice)._vptr_Lattice[0xb])();
    local_19 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->boundary_constraint_,CONCAT44(extraout_var,iVar1) + 4,&local_19);
  }
  (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start[pos] = (uchar)boundary_constraint_type;
  return;
}

Assistant:

void LatticeImpl::set_boundary_constraint(size_t pos,
                                          int boundary_constraint_type) {
  if (boundary_constraint_.empty()) {
    boundary_constraint_.resize(size() + 4, MECAB_ANY_BOUNDARY);
  }
  boundary_constraint_[pos] = boundary_constraint_type;
}